

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moderation.cpp
# Opt level: O2

void Commands::Kick(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Command_Source *from,bool announce)

{
  int iVar1;
  undefined4 extraout_var;
  Character *victim;
  function<void_(World_*,_Command_Source_*,_Character_*,_bool)> local_60;
  string local_40;
  
  iVar1 = (*from->_vptr_Command_Source[4])(from);
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  victim = World::GetCharacter((World *)CONCAT44(extraout_var,iVar1),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_60.super__Function_base._M_functor._M_unused._M_object = World::Kick;
  local_60.super__Function_base._M_functor._8_8_ = 0;
  local_60._M_invoker =
       std::
       _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_std::_Mem_fn<void_(World::*)(Command_Source_*,_Character_*,_bool)>_>
       ::_M_invoke;
  local_60.super__Function_base._M_manager =
       std::
       _Function_handler<void_(World_*,_Command_Source_*,_Character_*,_bool),_std::_Mem_fn<void_(World::*)(Command_Source_*,_Character_*,_bool)>_>
       ::_M_manager;
  do_punishment(from,victim,&local_60,announce);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  return;
}

Assistant:

void Kick(const std::vector<std::string>& arguments, Command_Source* from, bool announce = true)
{
	Character* victim = from->SourceWorld()->GetCharacter(arguments[0]);
	do_punishment(from, victim, std::mem_fn(&World::Kick), announce);
}